

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O1

void lex_longstring(LexState *ls,TValue *tv,int sep)

{
  SBuf *sb;
  LexChar LVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  GCstr *pGVar5;
  char *pcVar6;
  ErrMsg em;
  
  LVar1 = ls->c;
  uVar4 = (ls->sb).p.ptr32;
  pcVar6 = (char *)(ulong)uVar4;
  sb = &ls->sb;
  if ((ls->sb).e.ptr32 == uVar4) {
    pcVar6 = lj_buf_more2(sb,1);
  }
  *pcVar6 = (char)LVar1;
  (ls->sb).p.ptr32 = (int)pcVar6 + 1;
  pbVar2 = (byte *)ls->p;
  if (pbVar2 < ls->pe) {
    ls->p = (char *)(pbVar2 + 1);
    uVar4 = (uint)*pbVar2;
  }
  else {
    uVar4 = lex_more(ls);
  }
  ls->c = uVar4;
  if ((uVar4 == 0xd) || (uVar4 == 10)) {
    lex_newline(ls);
  }
  do {
    while (iVar3 = ls->c, 0xc < iVar3) {
      if (iVar3 == 0xd) goto LAB_00124efb;
      if (iVar3 != 0x5d) goto LAB_00124f2f;
      iVar3 = lex_skipeq(ls);
      if (iVar3 == sep) {
        LVar1 = ls->c;
        uVar4 = (ls->sb).p.ptr32;
        pcVar6 = (char *)(ulong)uVar4;
        if ((ls->sb).e.ptr32 == uVar4) {
          pcVar6 = lj_buf_more2(sb,1);
        }
        *pcVar6 = (char)LVar1;
        (ls->sb).p.ptr32 = (int)pcVar6 + 1;
        pbVar2 = (byte *)ls->p;
        if (pbVar2 < ls->pe) {
          ls->p = (char *)(pbVar2 + 1);
          uVar4 = (uint)*pbVar2;
        }
        else {
          uVar4 = lex_more(ls);
        }
        ls->c = uVar4;
        if (tv != (TValue *)0x0) {
          uVar4 = (ls->sb).b.ptr32;
          pGVar5 = lj_parse_keepstr(ls,(char *)((ulong)(uint)sep + (ulong)uVar4 + 2),
                                    (ulong)(((ls->sb).p.ptr32 - (uVar4 + sep * 2)) - 4));
          (tv->u32).lo = (uint32_t)pGVar5;
          (tv->field_2).it = 0xfffffffb;
        }
        return;
      }
    }
    if (iVar3 == 10) {
LAB_00124efb:
      uVar4 = (ls->sb).p.ptr32;
      pcVar6 = (char *)(ulong)uVar4;
      if ((ls->sb).e.ptr32 == uVar4) {
        pcVar6 = lj_buf_more2(sb,1);
      }
      *pcVar6 = '\n';
      (ls->sb).p.ptr32 = (int)pcVar6 + 1;
      lex_newline(ls);
      if (tv == (TValue *)0x0) {
        (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
      }
    }
    else {
      if (iVar3 == -1) {
        em = LJ_ERR_XLSTR;
        if (tv == (TValue *)0x0) {
          em = LJ_ERR_XLCOM;
        }
        lj_lex_error(ls,0x121,em);
      }
LAB_00124f2f:
      uVar4 = (ls->sb).p.ptr32;
      pcVar6 = (char *)(ulong)uVar4;
      if ((ls->sb).e.ptr32 == uVar4) {
        pcVar6 = lj_buf_more2(sb,1);
      }
      *pcVar6 = (char)iVar3;
      (ls->sb).p.ptr32 = (int)pcVar6 + 1;
      pbVar2 = (byte *)ls->p;
      if (pbVar2 < ls->pe) {
        ls->p = (char *)(pbVar2 + 1);
        uVar4 = (uint)*pbVar2;
      }
      else {
        uVar4 = lex_more(ls);
      }
      ls->c = uVar4;
    }
  } while( true );
}

Assistant:

static void lex_longstring(LexState *ls, TValue *tv, int sep)
{
  lex_savenext(ls);  /* Skip second '['. */
  if (lex_iseol(ls))  /* Skip initial newline. */
    lex_newline(ls);
  for (;;) {
    switch (ls->c) {
    case LEX_EOF:
      lj_lex_error(ls, TK_eof, tv ? LJ_ERR_XLSTR : LJ_ERR_XLCOM);
      break;
    case ']':
      if (lex_skipeq(ls) == sep) {
	lex_savenext(ls);  /* Skip second ']'. */
	goto endloop;
      }
      break;
    case '\n':
    case '\r':
      lex_save(ls, '\n');
      lex_newline(ls);
      if (!tv) lj_buf_reset(&ls->sb);  /* Don't waste space for comments. */
      break;
    default:
      lex_savenext(ls);
      break;
    }
  } endloop:
  if (tv) {
    GCstr *str = lj_parse_keepstr(ls, sbufB(&ls->sb) + (2 + (MSize)sep),
				      sbuflen(&ls->sb) - 2*(2 + (MSize)sep));
    setstrV(ls->L, tv, str);
  }
}